

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O2

int ncnn::binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  int iVar4;
  ulong uVar5;
  undefined1 (*pauVar6) [64];
  int iVar7;
  undefined1 (*pauVar8) [64];
  int iVar9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined4 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  
  uVar1 = b->c;
  iVar7 = b->h * b->w * b->d * b->elempack;
  Mat::create_like(c,b,opt->blob_allocator);
  iVar4 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    iVar4 = 0;
    uVar11 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar11 = 0;
    }
    for (uVar5 = 0; uVar5 != uVar11; uVar5 = uVar5 + 1) {
      auVar12 = vbroadcastss_avx512f(ZEXT416(*a->data));
      pauVar6 = (undefined1 (*) [64])(b->cstep * uVar5 * b->elemsize + (long)b->data);
      pauVar8 = (undefined1 (*) [64])(c->cstep * uVar5 * c->elemsize + (long)c->data);
      for (iVar9 = 0; iVar9 + 0xf < iVar7; iVar9 = iVar9 + 0x10) {
        auVar13 = vminps_avx512f(auVar12,*pauVar6);
        *pauVar8 = auVar13;
        pauVar6 = pauVar6 + 1;
        pauVar8 = pauVar8 + 1;
      }
      uVar14 = auVar12._0_4_;
      auVar16._4_4_ = uVar14;
      auVar16._0_4_ = uVar14;
      auVar16._8_4_ = uVar14;
      auVar16._12_4_ = uVar14;
      auVar16._16_4_ = uVar14;
      auVar16._20_4_ = uVar14;
      auVar16._24_4_ = uVar14;
      auVar16._28_4_ = uVar14;
      for (; iVar9 + 7 < iVar7; iVar9 = iVar9 + 8) {
        auVar3 = vminps_avx(auVar16,*(undefined1 (*) [32])*pauVar6);
        *(undefined1 (*) [32])*pauVar8 = auVar3;
        pauVar6 = (undefined1 (*) [64])(*pauVar6 + 0x20);
        pauVar8 = (undefined1 (*) [64])((long)*pauVar8 + 0x20);
      }
      auVar15._4_4_ = uVar14;
      auVar15._0_4_ = uVar14;
      auVar15._8_4_ = uVar14;
      auVar15._12_4_ = uVar14;
      for (; iVar9 + 3 < iVar7; iVar9 = iVar9 + 4) {
        auVar2 = vminps_avx(auVar15,*(undefined1 (*) [16])*pauVar6);
        *(undefined1 (*) [16])*pauVar8 = auVar2;
        pauVar6 = (undefined1 (*) [64])(*pauVar6 + 0x10);
        pauVar8 = (undefined1 (*) [64])((long)*pauVar8 + 0x10);
      }
      lVar10 = 0;
      for (; iVar9 < iVar7; iVar9 = iVar9 + 1) {
        auVar15 = vminss_avx(auVar12._0_16_,ZEXT416(*(uint *)(*pauVar6 + lVar10)));
        *(int *)((long)*pauVar8 + lVar10) = auVar15._0_4_;
        lVar10 = lVar10 + 4;
      }
    }
  }
  return iVar4;
}

Assistant:

static int binary_op_2_3_4_20(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = b.w;
    int h = b.h;
    int d = b.d;
    int channels = b.c;
    int elempack = b.elempack;
    int size = w * h * d * elempack;

    // type 2 3 4 20
    c.create_like(b, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float a0 = a[0];
        const float* ptr = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _a0_avx512 = _mm512_set1_ps(a0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_a0_avx512, _p);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _a0_avx = _mm256_set1_ps(a0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_a0_avx, _p);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _a0 = _mm_set1_ps(a0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_a0, _p);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(a0, *ptr);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}